

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  void **in_RDX;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  int in_stack_00000020;
  int in_stack_00000024;
  Mat *in_stack_00000028;
  Mat *in_stack_00000030;
  Mat *in_stack_00000038;
  Mat *in_stack_00000040;
  int ret;
  Mat top_blob_bordered;
  int outw;
  int kernel_extent_w;
  size_t elemsize;
  int w;
  int in_stack_00000340;
  int in_stack_00000348;
  int in_stack_00000350;
  Mat *in_stack_00000358;
  Option *in_stack_00000360;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  size_t in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  int _w;
  Mat *in_stack_fffffffffffffe50;
  void **ppvVar3;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  Mat *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6f;
  void *local_138;
  int *local_130;
  void *local_128;
  undefined4 local_120;
  long *local_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  int local_100;
  void *local_f8;
  int local_f0;
  int local_ec;
  undefined8 local_e8;
  int local_dc;
  void **local_d0;
  int local_b4;
  void **local_b0;
  void **local_a8;
  int local_98;
  undefined4 local_94;
  void **local_88;
  void **local_80;
  void **local_78;
  void **local_70;
  void **local_60;
  int local_48;
  undefined4 local_44;
  void **local_40;
  void *local_38;
  void **local_20;
  void **local_18;
  
  local_dc = *(int *)(in_RSI + 0x2c);
  local_e8 = *(undefined8 *)(in_RSI + 0x10);
  local_ec = *(int *)(in_RDI + 0xd8) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
  local_f0 = (local_dc + -1) * *(int *)(in_RDI + 0xdc) + local_ec + *(int *)(in_RDI + 0xe8);
  local_b0 = &local_138;
  local_138 = (void *)0x0;
  local_130 = (int *)0x0;
  local_128 = (void *)0x0;
  local_120 = 0;
  local_118 = (long *)0x0;
  local_110 = 0;
  local_10c = 0;
  local_108 = 0;
  local_104 = 0;
  local_100 = 0;
  local_f8 = (void *)0x0;
  _w = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_d0 = in_RDX;
  if (((*(int *)(in_RDI + 0xe0) < 1) && (*(int *)(in_RDI + 0xe4) < 1)) &&
     (*(int *)(in_RDI + 0xec) < 1)) {
    local_88 = &local_138;
    if (local_88 != in_RDX) {
      if (in_RDX[1] != (void *)0x0) {
        piVar1 = (int *)in_RDX[1];
        local_94 = 1;
        LOCK();
        local_98 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_138 = *in_RDX;
      local_130 = (int *)in_RDX[1];
      local_128 = in_RDX[2];
      local_120 = *(undefined4 *)(in_RDX + 3);
      local_118 = (long *)in_RDX[4];
      local_110 = *(undefined4 *)(in_RDX + 5);
      local_10c = *(undefined4 *)((long)in_RDX + 0x2c);
      local_108 = *(undefined4 *)(in_RDX + 6);
      local_104 = *(undefined4 *)((long)in_RDX + 0x34);
      local_100 = *(int *)(in_RDX + 7);
      local_f8 = in_RDX[8];
      local_60 = local_88;
    }
    local_80 = local_88;
    Mat::create(in_stack_fffffffffffffe50,_w,(int)in_stack_fffffffffffffe48,
                in_stack_fffffffffffffe40,
                (Allocator *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  else {
    Mat::create(in_stack_fffffffffffffe50,_w,(int)in_stack_fffffffffffffe48,
                in_stack_fffffffffffffe40,
                (Allocator *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  }
  local_70 = &local_138;
  if (local_138 != (void *)0x0) {
    local_20 = local_70;
  }
  if (local_138 != (void *)0x0 && (long)local_f8 * (long)local_100 != 0) {
    local_b4 = deconvolutiondepthwise1d
                         (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028,
                          in_stack_00000024,in_stack_00000020,in_stack_00000340,in_stack_00000348,
                          in_stack_00000350,in_stack_00000358,in_stack_00000360);
    if (local_b4 == 0) {
      cut_padding((DeconvolutionDepthWise1D *)
                  CONCAT17(in_stack_fffffffffffffe6f,in_stack_fffffffffffffe68),
                  in_stack_fffffffffffffe60,
                  (Mat *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
                  (Option *)in_stack_fffffffffffffe50);
      local_78 = local_d0;
      bVar2 = true;
      if (*local_d0 != (void *)0x0) {
        local_18 = local_d0;
        bVar2 = (long)local_d0[8] * (long)*(int *)(local_d0 + 7) == 0;
      }
      if (bVar2) {
        local_b4 = -100;
      }
      else {
        local_b4 = 0;
      }
    }
  }
  else {
    local_b4 = -100;
  }
  ppvVar3 = &local_138;
  if (local_130 != (int *)0x0) {
    local_44 = 0xffffffff;
    LOCK();
    local_48 = *local_130;
    *local_130 = *local_130 + -1;
    UNLOCK();
    if (local_48 == 1) {
      local_a8 = ppvVar3;
      local_40 = ppvVar3;
      if (local_118 == (long *)0x0) {
        local_38 = local_138;
        if (local_138 != (void *)0x0) {
          free(local_138);
        }
      }
      else {
        (**(code **)(*local_118 + 0x18))(local_118,local_138);
      }
    }
  }
  *ppvVar3 = (void *)0x0;
  ppvVar3[2] = (void *)0x0;
  *(undefined4 *)(ppvVar3 + 3) = 0;
  *(undefined4 *)(ppvVar3 + 5) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x2c) = 0;
  *(undefined4 *)(ppvVar3 + 6) = 0;
  *(undefined4 *)((long)ppvVar3 + 0x34) = 0;
  *(undefined4 *)(ppvVar3 + 7) = 0;
  ppvVar3[8] = (void *)0x0;
  ppvVar3[1] = (void *)0x0;
  return local_b4;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}